

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS
ref_search_nearest_element
          (REF_SEARCH ref_search,REF_INT node_per,REF_DBL *xyz,REF_DBL *position,REF_DBL *distance)

{
  REF_STATUS RVar1;
  undefined8 uVar2;
  
  if (node_per == 2) {
    RVar1 = ref_search_gather_seg(ref_search,xyz,0,position,distance);
    if (RVar1 == 0) {
      return 0;
    }
    uVar2 = 0x18b;
  }
  else {
    RVar1 = ref_search_gather_tri(ref_search,xyz,0,position,distance);
    if (RVar1 == 0) {
      return 0;
    }
    uVar2 = 0x18e;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",uVar2,
         "ref_search_nearest_element",1,"touches");
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_search_nearest_element(REF_SEARCH ref_search,
                                              REF_INT node_per, REF_DBL *xyz,
                                              REF_DBL *position,
                                              REF_DBL *distance) {
  REF_INT parent;
  parent = 0;
  if (2 == node_per) {
    RSS(ref_search_gather_seg(ref_search, xyz, parent, position, distance),
        "touches");
  } else {
    RSS(ref_search_gather_tri(ref_search, xyz, parent, position, distance),
        "touches");
  }
  return REF_SUCCESS;
}